

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMapDetails::
NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>::
transferToLeftSib(NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                  *this,uint32_t size,
                 NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                 *sib,uint32_t sibSize,uint32_t count)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  long lVar3;
  
  if (count != 0) {
    lVar3 = 0;
    do {
      puVar1 = (unsigned_long *)((long)&this->first[0].left + lVar3 * 2);
      uVar2 = puVar1[1];
      sib->first[sibSize].left = *puVar1;
      sib->first[sibSize].right = uVar2;
      sib->second[sibSize] = *(ValueDriver **)((long)this->second + lVar3);
      sibSize = sibSize + 1;
      lVar3 = lVar3 + 8;
    } while ((ulong)count << 3 != lVar3);
  }
  if (size != count) {
    lVar3 = 0;
    do {
      uVar2 = this->first[count].right;
      puVar1 = (unsigned_long *)((long)&this->first[0].left + lVar3 * 2);
      *puVar1 = this->first[count].left;
      puVar1[1] = uVar2;
      *(ValueDriver **)((long)this->second + lVar3) = this->second[count];
      count = count + 1;
      lVar3 = lVar3 + 8;
    } while (size != count);
  }
  return;
}

Assistant:

void copy(const NodeBase<TKey, TValue, M>& other, uint32_t src, uint32_t dst, uint32_t count) {
        SLANG_ASSERT(src + count <= M && dst + count <= N);
        for (uint32_t end = src + count; src != end; src++, dst++) {
            first[dst] = other.first[src];
            second[dst] = other.second[src];
        }
    }